

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScsAddress.cpp
# Opt level: O0

void __thiscall Scs::Address::Log(Address *this)

{
  int __af;
  size_t sVar1;
  sockaddr_in6 *ipv6;
  sockaddr_in *ipv4;
  char *ipver;
  void *addr;
  addrinfo *curr;
  char ipstr [46];
  Address *this_local;
  
  LogWriteLine("Logging addresses...");
  for (addr = this->m_address; addr != (void *)0x0; addr = *(void **)((long)addr + 0x28)) {
    if (*(int *)((long)addr + 4) == 2) {
      ipver = (char *)(*(long *)((long)addr + 0x18) + 4);
      ipv4 = (sockaddr_in *)anon_var_dwarf_154141;
    }
    else {
      ipver = (char *)(*(long *)((long)addr + 0x18) + 8);
      ipv4 = (sockaddr_in *)anon_var_dwarf_154157;
    }
    __af = *(int *)((long)addr + 4);
    sVar1 = countof<char,46ul>((char (*) [46])&curr);
    inet_ntop(__af,ipver,(char *)&curr,(socklen_t)sVar1);
    LogWriteLine("  %s: %s",ipv4,&curr);
  }
  return;
}

Assistant:

void Address::Log() const
{
	LogWriteLine("Logging addresses...");
	char ipstr[INET6_ADDRSTRLEN];
	auto curr = m_address;
	while (curr)
	{
        void *addr;
        const char *ipver;		
        // get the pointer to the address itself,
        // different fields in IPv4 and IPv6:
        if (curr->ai_family == AF_INET) // IPv4
		{ 
            struct sockaddr_in *ipv4 = (struct sockaddr_in *)curr->ai_addr;
            addr = &(ipv4->sin_addr);
            ipver = "IPv4";
        } 
		else // IPv6
		{ 
            struct sockaddr_in6 *ipv6 = (struct sockaddr_in6 *)curr->ai_addr;
            addr = &(ipv6->sin6_addr);
            ipver = "IPv6";
        }

        // convert the IP to a string and print it:
        ScsInetNtoP(curr->ai_family, addr, ipstr, countof(ipstr));
        LogWriteLine("  %s: %s", ipver, ipstr);
	
		// Advance to the next address
		curr = curr->ai_next;
	}
}